

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSocket.h
# Opt level: O2

void __thiscall uWS::HTTPSocket<false>::Data::Data(Data *this,SocketData *socketData)

{
  NodeData *pNVar1;
  SSL *pSVar2;
  void *pvVar3;
  Message *pMVar4;
  Message *pMVar5;
  uv_poll_t *puVar6;
  int iVar7;
  bool bVar8;
  undefined3 uVar9;
  
  pNVar1 = socketData->nodeData;
  pSVar2 = socketData->ssl;
  pvVar3 = socketData->user;
  iVar7 = socketData->poll;
  bVar8 = socketData->shuttingDown;
  uVar9 = *(undefined3 *)&socketData->field_0x1d;
  pMVar4 = (socketData->messageQueue).head;
  pMVar5 = (socketData->messageQueue).tail;
  puVar6 = socketData->prev;
  (this->super_SocketData).next = socketData->next;
  (this->super_SocketData).prev = puVar6;
  (this->super_SocketData).messageQueue.head = pMVar4;
  (this->super_SocketData).messageQueue.tail = pMVar5;
  (this->super_SocketData).user = pvVar3;
  (this->super_SocketData).poll = iVar7;
  (this->super_SocketData).shuttingDown = bVar8;
  *(undefined3 *)&(this->super_SocketData).field_0x1d = uVar9;
  (this->super_SocketData).nodeData = pNVar1;
  (this->super_SocketData).ssl = pSVar2;
  (this->httpBuffer)._M_dataplus._M_p = (pointer)&(this->httpBuffer).field_2;
  (this->httpBuffer)._M_string_length = 0;
  (this->httpBuffer).field_2._M_local_buf[0] = '\0';
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  (this->host)._M_string_length = 0;
  (this->host).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Data(uS::SocketData *socketData) : uS::SocketData(*socketData) {}